

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

string * hashBlockToHex_abi_cxx11_(HashBlock block)

{
  int i;
  long lVar1;
  long lVar2;
  string *in_RDI;
  long lVar3;
  ByteBitSet c;
  stringstream stream;
  _WordT local_1d0;
  reference local_1c8;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [88];
  
  local_1d0 = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar2 = 0xff;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != -4; lVar3 = lVar3 + -1) {
      local_1c8._M_bpos = lVar3 + 3;
      local_1c8._M_wp = &local_1d0;
      std::bitset<8UL>::reference::operator=
                (&local_1c8,
                 ((&c)[(ulong)(lVar3 + lVar2) >> 6].super__Base_bitset<1UL>._M_w >>
                  (lVar3 + lVar2 & 0x3fU) & 1) != 0);
    }
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    lVar2 = lVar2 + -4;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return in_RDI;
}

Assistant:

std::string hashBlockToHex(HashBlock block) {
    ByteBitSet c;
    std::stringstream stream;

    for (int i = 0; i < HASH_OUTPUT_SEGMENT_SIZE * 2; i++) {
        for (int j = 0; j < CHAR_SIZE_BIT / 2; j++) {
            c[(CHAR_SIZE_BIT / 2) - 1 - j] = block[HASH_OUTPUT_SIZE - 1 - (i * CHAR_SIZE_BIT / 2) - j];
        }

        stream << std::hex << c.to_ulong();

    }


    return stream.str();
}